

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::
allocate<spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,TypedID<(spirv_cross::Types)1> *p,
          TypedID<(spirv_cross::Types)1> *p_1)

{
  Vector<spirv_cross::SPIRFunction_*> *this_00;
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
  _Var2;
  ulong count;
  SPIRFunction *this_01;
  _Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> _Var3;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>)malloc(count * 800);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl !=
        (SPIRFunction *)0x0) {
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve(this_00,count);
      _Var3._M_head_impl =
           (SPIRFunction *)
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size
                           + 1);
        sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar1] =
             _Var3._M_head_impl;
        (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size = sVar1 + 1;
        _Var3._M_head_impl = _Var3._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRFunction_*,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRFunction_*,_false>._M_head_impl !=
          (SPIRFunction *)0x0) goto LAB_002875f0;
    }
    this_01 = (SPIRFunction *)0x0;
  }
  else {
LAB_002875f0:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.buffer_size;
    this_01 = (this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::resize(this_00,sVar1 - 1);
    }
    SPIRFunction::SPIRFunction(this_01,(TypeID)p->id,(TypeID)p_1->id);
  }
  return this_01;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}